

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

BOOL should_be_guarded(dw_chest_content item)

{
  BOOL local_c;
  dw_chest_content item_local;
  
  if ((((item == ARMOR) || (item == TOKEN)) || (item == HARP)) ||
     ((item == STONES || (item == SWORD)))) {
    local_c = TRUE;
  }
  else {
    local_c = FALSE;
  }
  return local_c;
}

Assistant:

static BOOL should_be_guarded(dw_chest_content item)
{
    switch(item)
    {
        case STONES:
        case HARP:
        case TOKEN:
        case SWORD:
        case ARMOR:
            return TRUE;
        default:
            return FALSE;
    }
}